

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcsdump.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  pointer pcVar5;
  type pbVar6;
  runtime_error *prVar7;
  long in_RSI;
  int in_EDI;
  string *in_stack_00000088;
  File *in_stack_00000090;
  Header h;
  FileHeader fh;
  __array buf;
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ifs;
  int nbytes;
  PrimaryHeader ph;
  File file;
  int i;
  int nread;
  int rv;
  File *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd34;
  size_t in_stack_fffffffffffffd38;
  pointer in_stack_fffffffffffffd68;
  string local_250 [35];
  undefined1 local_22d;
  undefined4 local_22c;
  string local_228 [80];
  int local_1d8;
  undefined1 local_1cd;
  undefined4 local_1cc;
  string local_1c8 [120];
  int *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffebc;
  FileHeader *in_stack_fffffffffffffec0;
  char (*in_stack_fffffffffffffec8) [39];
  byte local_104;
  long local_f8;
  allocator local_d9;
  string local_d8 [188];
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_1c = _optind;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while( true ) {
    if (local_8 <= local_1c) {
      return 0;
    }
    pcVar1 = *(char **)(local_10 + (long)local_1c * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,pcVar1,&local_d9);
    lrit::File::File(in_stack_00000090,in_stack_00000088);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    lrit::File::getHeader<lrit::PrimaryHeader>(in_stack_fffffffffffffd20);
    if (local_104 != 0x82) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"File ");
      poVar4 = std::operator<<(poVar4,*(char **)(local_10 + (long)local_1c * 8));
      poVar4 = std::operator<<(poVar4," has file type ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)local_104);
      poVar4 = std::operator<<(poVar4," (expected: 130)");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    iVar3 = (int)(local_f8 + 7U >> 3);
    lrit::File::getData((File *)in_stack_fffffffffffffd68);
    std::make_unique<char[]>(in_stack_fffffffffffffd38);
    in_stack_fffffffffffffd68 =
         std::
         unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
         ::operator->((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                       *)0x114b29);
    pcVar5 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                       ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                        in_stack_fffffffffffffd20);
    std::istream::read((char *)in_stack_fffffffffffffd68,(long)pcVar5);
    pbVar6 = std::
             unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
             ::operator*((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                          *)in_stack_fffffffffffffd20);
    bVar2 = std::ios::operator!((ios *)((long)&pbVar6->_vptr_basic_istream +
                                       (long)pbVar6->_vptr_basic_istream[-3]));
    if ((bVar2 & 1) != 0) {
      uVar8 = CONCAT13(1,(int3)in_stack_fffffffffffffeb8);
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      util::str<char[28],char[89],char[2],int>
                ((char (*) [28])in_stack_fffffffffffffec8,(char (*) [89])in_stack_fffffffffffffec0,
                 (char (*) [2])CONCAT44(0x1e,uVar8),in_stack_fffffffffffffeb0);
      std::runtime_error::runtime_error(prVar7,(string *)&stack0xfffffffffffffec0);
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_18 = 0;
    dcs::FileHeader::FileHeader((FileHeader *)in_stack_fffffffffffffd20);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::get
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_fffffffffffffd20);
    local_14 = dcs::FileHeader::readFrom
                         (in_stack_fffffffffffffec0,
                          (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                          (size_t)in_stack_fffffffffffffeb0);
    if (local_14 < 1) break;
    for (local_18 = local_14 + local_18; local_18 < iVar3;
        local_18 = local_1d8 + in_stack_fffffffffffffd34 + local_18 + 0x21) {
      std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_fffffffffffffd20);
      in_stack_fffffffffffffd34 =
           dcs::Header::readFrom
                     ((Header *)
                      file.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,(char *)file.file_.field_2._8_8_,
                      file.file_.field_2._M_allocated_capacity);
      local_14 = in_stack_fffffffffffffd34;
      if (in_stack_fffffffffffffd34 < 1) {
        local_22d = 1;
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_22c = 0x2b;
        util::str<char[30],char[89],char[2],int>
                  ((char (*) [30])in_stack_fffffffffffffec8,(char (*) [89])in_stack_fffffffffffffec0
                   ,(char (*) [2])CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   in_stack_fffffffffffffeb0);
        std::runtime_error::runtime_error(prVar7,local_228);
        local_22d = 0;
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    if (local_18 != iVar3) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      util::str<char[39],char[89],char[2],int>
                (in_stack_fffffffffffffec8,(char (*) [89])in_stack_fffffffffffffec0,
                 (char (*) [2])CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                 in_stack_fffffffffffffeb0);
      std::runtime_error::runtime_error(prVar7,local_250);
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    dcs::FileHeader::~FileHeader((FileHeader *)in_stack_fffffffffffffd20);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)in_stack_fffffffffffffd20);
    std::
    unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    lrit::File::~File(in_stack_fffffffffffffd20);
    local_1c = local_1c + 1;
  }
  local_1cd = 1;
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_1cc = 0x24;
  util::str<char[30],char[89],char[2],int>
            ((char (*) [30])in_stack_fffffffffffffec8,(char (*) [89])in_stack_fffffffffffffec0,
             (char (*) [2])CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
             in_stack_fffffffffffffeb0);
  std::runtime_error::runtime_error(prVar7,local_1c8);
  local_1cd = 0;
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int argc, char** argv) {
  int rv;
  int nread;

  for (int i = optind; i < argc; i++) {
    auto file = lrit::File(argv[i]);
    auto ph = file.getHeader<lrit::PrimaryHeader>();
    if (ph.fileType != 130) {
      std::cerr
        << "File " << argv[i]
        << " has file type " << int(ph.fileType)
        << " (expected: 130)"
        << std::endl;
      exit(1);
    }

    // Read DCS data
    int nbytes = (ph.dataLength + 7) / 8;
    auto ifs = file.getData();
    auto buf = std::make_unique<char[]>(nbytes);
    ifs->read(buf.get(), nbytes);
    ASSERT(*ifs);
    nread = 0;

    // Read DCS file header (container for multiple DCS payloads)
    dcs::FileHeader fh;
    rv = fh.readFrom(buf.get(), nbytes);
    ASSERT(rv > 0);
    nread += rv;

    while (nread < nbytes) {
      // Read DCS header
      dcs::Header h;
      rv = h.readFrom(buf.get() + nread, nbytes - nread);
      ASSERT(rv > 0);
      nread += rv;

      // Skip over actual data
      nread += h.dataLength;

      // Skip 14 characters for time with milliseconds (in DCS format).
      // Skip 1 whitepace.
      // Skip 14 characters for time with milliseconds (in DCS format).
      // Skip 4 bytes (same prelude as prelude to first header)
      nread += 14 + 1 + 14 + 4;
    }

    ASSERT(nread == nbytes);
  }

  return 0;
}